

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O3

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::swap
          (WorkData *this,uint32_t aVarId,uint32_t aRegId,uint32_t bVarId,uint32_t bRegId)

{
  uint uVar1;
  uint extraout_EDX;
  uint8_t uVar2;
  
  if (aRegId < 0x20) {
    if ((this->_assignedRegs >> (aRegId & 0x1f) & 1) == 0) goto LAB_0011d0ed;
    if (0x1f < bRegId) goto LAB_0011d0f2;
    if ((this->_assignedRegs >> (bRegId & 0x1f) & 1) == 0) goto LAB_0011d0f7;
    if (this->_physToVarId[aRegId] != aVarId) goto LAB_0011d0fc;
    if (this->_physToVarId[bRegId] == bVarId) {
      this->_physToVarId[aRegId] = (uint8_t)bVarId;
      this->_physToVarId[bRegId] = (uint8_t)aVarId;
      return;
    }
  }
  else {
    swap();
LAB_0011d0ed:
    swap();
LAB_0011d0f2:
    swap();
LAB_0011d0f7:
    swap();
LAB_0011d0fc:
    swap();
  }
  uVar2 = (uint8_t)aVarId;
  swap();
  if (extraout_EDX < 0x20) {
    uVar1 = this->_assignedRegs;
    if ((uVar1 >> (extraout_EDX & 0x1f) & 1) == 0) {
      if (this->_physToVarId[extraout_EDX] == 0xff) {
        this->_physToVarId[extraout_EDX] = uVar2;
        this->_assignedRegs = uVar1 ^ 1 << ((byte)extraout_EDX & 0x1f);
        return;
      }
      goto LAB_0011d13f;
    }
  }
  else {
    assign();
  }
  assign();
LAB_0011d13f:
  assign();
  return;
}

Assistant:

inline void swap(uint32_t aVarId, uint32_t aRegId, uint32_t bVarId, uint32_t bRegId) noexcept {
      ASMJIT_ASSERT(isAssigned(aRegId));
      ASMJIT_ASSERT(isAssigned(bRegId));
      ASMJIT_ASSERT(_physToVarId[aRegId] == aVarId);
      ASMJIT_ASSERT(_physToVarId[bRegId] == bVarId);

      _physToVarId[aRegId] = uint8_t(bVarId);
      _physToVarId[bRegId] = uint8_t(aVarId);
    }